

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsip.cpp
# Opt level: O0

void __thiscall tsip::tsip(tsip *this,string *_port,bool verbose)

{
  byte bVar1;
  bool bVar2;
  byte in_DL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  tsip *in_RDI;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  string local_48 [40];
  string *in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe8;
  
  bVar1 = in_DL & 1;
  std::__cxx11::string::string((string *)&in_RDI->gps_port);
  set_verbose(in_RDI,true);
  set_debug(in_RDI,false);
  in_RDI->_rad = 57.29577951308232;
  init_rpt(in_RDI);
  bVar2 = std::operator!=(in_RSI,(char *)CONCAT17(in_stack_ffffffffffffff9f,
                                                  in_stack_ffffffffffffff98));
  if (bVar2) {
    std::__cxx11::string::string(local_48,(string *)in_RSI);
    open_gps_port((tsip *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe0);
    std::__cxx11::string::~string(local_48);
  }
  return;
}

Assistant:

tsip::tsip(std::string _port, bool verbose) {
	// set verbose
	set_verbose(true);
	set_debug(false);

	//conversion factor to compute radians to degrees
	_rad = 180/M_PI;
	//init report fields
	init_rpt();

	if (_port != "") {
		open_gps_port(_port);
	}
	//// set the port
	//set_gps_port(port);

    //file = fopen(gps_port.c_str(), "r");
////        FILE *file = fopen(gps_port.c_str(), "r");

    //if(!file)
    //{
		////if open fails - terminate run
        //printf("Cannot open %s\n", gps_port.c_str());
        //exit;
    //}

    //setup_serial_port(file);
}